

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Matrix<double,_2,_2> *
gl4cts::Math::inverse<2>(Matrix<double,_2,_2> *__return_storage_ptr__,Matrix<double,_2,_2> *matrix)

{
  GLuint c;
  ulong uVar1;
  GLuint r;
  Matrix<double,_2,_2> *extraout_RDX;
  Matrix<double,_2,_2> *mat;
  ulong uVar2;
  Matrix<double,_2,_2> *pMVar3;
  double dVar4;
  Matrix<double,_2,_2> cof;
  Matrix<double,_2,_2> adjugate;
  Matrix<double,_2,_2> local_58;
  Matrix<double,_2,_2> local_38;
  
  pMVar3 = &local_58;
  tcu::Matrix<double,_2,_2>::Matrix(&local_58);
  mat = extraout_RDX;
  for (uVar1 = 0; uVar1 != 2; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 != 2; uVar2 = uVar2 + 1) {
      dVar4 = (matrix->m_data).m_data[uVar1 ^ 1].m_data[uVar2 ^ 1];
      if (((int)uVar1 + (int)uVar2 & 1U) != 0) {
        dVar4 = -dVar4;
      }
      *(double *)((long)pMVar3 + uVar2 * 8) = dVar4;
    }
    pMVar3 = (Matrix<double,_2,_2> *)((long)pMVar3 + 0x10);
    mat = (Matrix<double,_2,_2> *)0x2;
  }
  tcu::transpose<double,2,2>(&local_38,(tcu *)&local_58,mat);
  tcu::operator*(__return_storage_ptr__,&local_38,
                 1.0 / ((matrix->m_data).m_data[0].m_data[0] * (matrix->m_data).m_data[1].m_data[1]
                       - (matrix->m_data).m_data[1].m_data[0] * (matrix->m_data).m_data[0].m_data[1]
                       ));
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}